

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.c
# Opt level: O1

axbStatus_t axbVecDestroy(axbVec_s *vec)

{
  axbStatus_t aVar1;
  
  if (vec->init == 0x1d232) {
    vec->init = 0x1d233;
    aVar1 = 0;
    (*vec->memBackend->op_free)(vec->data,(void *)0x0);
    free(vec->name);
    free(vec);
  }
  else {
    axbVecDestroy_cold_1();
    aVar1 = 0x1d232;
  }
  return aVar1;
}

Assistant:

axbStatus_t axbVecDestroy(struct axbVec_s *vec)
{
  AXB_VECTOR_INIT_CHECK(vec);
  vec->init += 1;

  vec->memBackend->op_free(vec->data, NULL);
  free(vec->name);
  free(vec);
  return 0;
}